

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::preprocess_op_codes(CompilerMSL *this)

{
  ExecutionModel EVar1;
  SPIRFunction *func;
  allocator local_b1;
  string local_b0;
  OpCodePreprocessor preproc;
  
  preproc.result_types._M_h._M_buckets = &preproc.result_types._M_h._M_single_bucket;
  preproc.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpCodePreprocessor_003a6eb8;
  preproc.result_types._M_h._M_bucket_count = 1;
  preproc.result_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  preproc.result_types._M_h._M_element_count = 0;
  preproc.result_types._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  preproc.result_types._M_h._M_rehash_policy._M_next_resize = 0;
  preproc.result_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  preproc.image_pointers._M_h._M_buckets = &preproc.image_pointers._M_h._M_single_bucket;
  preproc.image_pointers._M_h._M_bucket_count = 1;
  preproc.image_pointers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  preproc.image_pointers._M_h._M_element_count = 0;
  preproc.image_pointers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  preproc.image_pointers._M_h._M_rehash_policy._M_next_resize = 0;
  preproc.image_pointers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  preproc.suppress_missing_prototypes = false;
  preproc.uses_atomics = false;
  preproc.uses_resource_write = false;
  preproc.needs_subgroup_invocation_id = false;
  preproc.compiler = this;
  func = Compiler::get<spirv_cross::SPIRFunction>
                   ((Compiler *)this,
                    (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  Compiler::traverse_all_reachable_opcodes((Compiler *)this,func,&preproc.super_OpcodeHandler);
  this->suppress_missing_prototypes = preproc.suppress_missing_prototypes;
  if (preproc.uses_atomics == true) {
    ::std::__cxx11::string::string((string *)&local_b0,"#include <metal_atomic>",&local_b1);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::string
              ((string *)&local_b0,"#pragma clang diagnostic ignored \"-Wunused-variable\"",
               &local_b1);
    add_pragma_line(this,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  if (preproc.uses_resource_write == true) {
    this->is_rasterization_disabled = true;
  }
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  if (EVar1 != ExecutionModelTessellationControl) {
    EVar1 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar1 != ExecutionModelVertex) || ((this->msl_options).vertex_for_tessellation != true))
    goto LAB_00288fe6;
  }
  this->is_rasterization_disabled = true;
  this->capture_output_to_buffer = true;
LAB_00288fe6:
  if (preproc.needs_subgroup_invocation_id == true) {
    this->needs_subgroup_invocation_id = true;
  }
  OpCodePreprocessor::~OpCodePreprocessor(&preproc);
  return;
}

Assistant:

void CompilerMSL::preprocess_op_codes()
{
	OpCodePreprocessor preproc(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), preproc);

	suppress_missing_prototypes = preproc.suppress_missing_prototypes;

	if (preproc.uses_atomics)
	{
		add_header_line("#include <metal_atomic>");
		add_pragma_line("#pragma clang diagnostic ignored \"-Wunused-variable\"");
	}

	// Metal vertex functions that write to resources must disable rasterization and return void.
	if (preproc.uses_resource_write)
		is_rasterization_disabled = true;

	// Tessellation control shaders are run as compute functions in Metal, and so
	// must capture their output to a buffer.
	if (get_execution_model() == ExecutionModelTessellationControl ||
	    (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
	{
		is_rasterization_disabled = true;
		capture_output_to_buffer = true;
	}

	if (preproc.needs_subgroup_invocation_id)
		needs_subgroup_invocation_id = true;
}